

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_handle_archipelago.hpp
# Opt level: O3

void __thiscall
PatchHandleArchipelago::handle_npc_set_uuid_on_reward
          (PatchHandleArchipelago *this,ROM *rom,RandomizerWorld *world)

{
  _func_int **pp_Var1;
  ROM *this_00;
  uint32_t uVar2;
  Code *code;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  Code proc;
  allocator_type local_17a;
  allocator_type local_179;
  undefined1 local_178 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_130;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f8;
  ROM *local_e0;
  DataRegister local_d8;
  Code local_c8;
  AddressRegister local_50;
  AddressRegister local_40;
  
  local_e0 = rom;
  uVar2 = inject_npc_addr_to_uuid_table(rom,world);
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178[8] = 7;
  local_178._0_8_ = &PTR_getXn_00262be0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::clr(&local_c8,(Param *)local_178,LONG);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_f8.
                         super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_178._0_8_ = &PTR_getXn_00262cd8;
  local_178._12_4_ = 2;
  local_178._8_4_ = uVar2;
  md::Code::lea(&local_c8,(Param *)local_178,(AddressRegister *)&local_f8);
  pp_Var1 = (_func_int **)(local_178 + 0x10);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"loop","");
  md::Code::label(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  local_d8.super_Register._code = '\x01';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_178._16_8_ = &local_50;
  local_50.super_Register._code = '\a';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_178._0_8_ = &PTR_getXn_00262d58;
  _Stack_160._M_impl._0_5_ = 2;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c98;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x2ffffffff;
  local_178._8_8_ = &local_d8;
  md::Code::cmpi(&local_c8,(ImmediateValue *)&local_f8,(Param *)local_178,LONG);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"return","");
  md::Code::beq(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_f8.
                         super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262c50;
  local_d8.super_Register._code = '\a';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  local_178._0_8_ = &PTR_getXn_00262d58;
  _Stack_160._M_impl._0_5_ = 2;
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_178._8_8_ = (ImmediateValue *)&local_f8;
  local_178._16_8_ = &local_d8;
  md::Code::cmpa(&local_c8,(Param *)local_178,&local_50);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"not_this_reward","");
  md::Code::bne(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_178[8] = 7;
  local_178._0_8_ = &PTR_getXn_00262be0;
  md::Code::lsx(&local_c8,'\x02',(DataRegister *)local_178,false,WORD);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_f8.
                         super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_7_,7);
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262be0;
  local_178._0_8_ = &PTR_getXn_00262c98;
  local_178._8_8_ = (pointer)0x100000250;
  md::Code::addi(&local_c8,(ImmediateValue *)local_178,(Param *)&local_f8,WORD);
  local_178[8] = 7;
  local_178._0_8_ = &PTR_getXn_00262be0;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262cd8;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff0026;
  md::Code::move(&local_c8,(Param *)local_178,(Param *)&local_f8,WORD);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"return","");
  md::Code::bra(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"not_this_reward","");
  md::Code::label(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_178[8] = 7;
  local_178._0_8_ = &PTR_getXn_00262be0;
  md::Code::addq(&local_c8,'\x04',(Register *)local_178,BYTE);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"loop","");
  md::Code::bra(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"return","");
  md::Code::label(&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  local_50.super_Register._code = '\0';
  local_50.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            ((vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_178,__l,&local_179
            );
  local_40.super_Register._code = '\x01';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  __l_00._M_len = 1;
  __l_00._M_array = &local_40;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f8,__l_00,&local_17a);
  this_00 = local_e0;
  local_d8.super_Register._code = '\a';
  local_d8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,(vector<md::DataRegister,_std::allocator<md::DataRegister>_> *)local_178
                  ,&local_f8,false,(AddressRegister *)&local_d8,LONG);
  if (local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
  }
  md::Code::rts(&local_c8);
  local_178._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
  uVar2 = md::ROM::inject_code(this_00,&local_c8,(string *)local_178);
  if ((_func_int **)local_178._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._0_8_,(ulong)(local_178._16_8_ + 1));
  }
  _Stack_160._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_160._M_impl.super__Rb_tree_header._M_header;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_160._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_130._M_impl._0_8_ = 0;
  _Stack_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_160._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._16_8_ = 0;
  _Stack_160._M_impl._0_8_ = 0;
  local_178._0_8_ = (_func_int **)0x0;
  local_178._8_8_ = (pointer)0x0;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_130._M_impl.super__Rb_tree_header._M_header;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00262cd8;
  local_f8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)CONCAT44(2,uVar2);
  _Stack_160._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_160._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_130._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_130._M_impl.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_178,(Param *)&local_f8);
  md::ROM::set_code(this_00,0x28dde,code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_130);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_160);
  if ((_func_int **)local_178._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8._pending_branches._M_t);
  if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void handle_npc_set_uuid_on_reward(md::ROM& rom, RandomizerWorld& world)
    {
        // Inject a lookup table to determine the UUID of a NPC reward based on its address
        // This is injected at "inject_code" time since it needs for RemoveStoryDependency patch to execute its
        // own inject_code routine to have the correct address for the vanilla Red Jewel item source.
        uint32_t npc_addr_to_uuid_table_addr = inject_npc_addr_to_uuid_table(rom, world);

        md::Code proc;
        {
            proc.clrl(reg_D7);
            proc.lea(npc_addr_to_uuid_table_addr, reg_A1);
            proc.label("loop");
            {
                proc.cmpil(0xFFFFFFFF, addr_(reg_A1, reg_D7));
                proc.beq("return"); // We reached the end of the table, this reward is not handled, just skip it
                proc.cmpa(addr_(reg_A1, reg_D7), reg_A0);
                proc.bne("not_this_reward");
                {
                    proc.lsrw(2, reg_D7);
                    proc.addiw(ItemSourceReward::base_reward_uuid(), reg_D7);
                    proc.movew(reg_D7, addr_(ADDR_ARCHIPELAGO_CURRENT_LOCATION_UUID));
                    proc.bra("return");
                }
                proc.label("not_this_reward");
                proc.addqb(4, reg_D7);
                proc.bra("loop");
            }
        }
        proc.label("return");
        proc.movem_from_stack({ reg_D0 }, { reg_A1 });
        proc.rts();

        uint32_t proc_addr = rom.inject_code(proc);
        rom.set_code(0x28DDE, md::Code().jmp(proc_addr));
    }